

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

void __thiscall icu_63::NoopNormalizer2::NoopNormalizer2(NoopNormalizer2 *this)

{
  NoopNormalizer2 *this_local;
  
  Normalizer2::Normalizer2(&this->super_Normalizer2);
  (this->super_Normalizer2).super_UObject._vptr_UObject =
       (_func_int **)&PTR__NoopNormalizer2_004f2eb8;
  return;
}

Assistant:

virtual UnicodeString &
    normalize(const UnicodeString &src,
              UnicodeString &dest,
              UErrorCode &errorCode) const U_OVERRIDE {
        if(U_SUCCESS(errorCode)) {
            if(&dest!=&src) {
                dest=src;
            } else {
                errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        return dest;
    }